

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidi.c
# Opt level: O0

_Bool is_rtl(wchar_t c)

{
  byte bVar1;
  _Bool _Var2;
  wchar_t c_local;
  
  bVar1 = bidi_getType(c);
  _Var2 = typeIsBidiActive((uint)bVar1);
  return _Var2;
}

Assistant:

bool is_rtl(int c)
{
    return typeIsBidiActive(bidi_getType(c));
}